

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O1

SimpleStringMemoryBlock * __thiscall
SimpleStringInternalCache::allocateNewCacheBlockFrom
          (SimpleStringInternalCache *this,SimpleStringInternalCacheNode *node)

{
  size_t sVar1;
  SimpleStringMemoryBlock *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleStringMemoryBlock *pSVar4;
  
  sVar1 = node->size_;
  pSVar2 = node->usedMemoryHead_;
  iVar3 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                    (this->allocator_,0x10,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                     ,0x67);
  pSVar4 = (SimpleStringMemoryBlock *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                    (this->allocator_,sVar1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                     ,0x68);
  pSVar4->memory_ = (char *)CONCAT44(extraout_var_00,iVar3);
  pSVar4->next_ = pSVar2;
  pSVar4->next_ = node->usedMemoryHead_;
  node->usedMemoryHead_ = pSVar4;
  return pSVar4;
}

Assistant:

SimpleStringMemoryBlock* SimpleStringInternalCache::allocateNewCacheBlockFrom(SimpleStringInternalCacheNode* node)
{
    SimpleStringMemoryBlock* block = createSimpleStringMemoryBlock(node->size_, node->usedMemoryHead_);
    node->usedMemoryHead_ = addToSimpleStringMemoryBlockList(block, node->usedMemoryHead_);
    return block;
}